

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# radix_partitioning.cpp
# Opt level: O2

void duckdb::
     RadixBitsSwitch<duckdb::ComputePartitionIndicesFunctor,void,duckdb::Vector&,duckdb::Vector&,unsigned_long,duckdb::SelectionVector_const&,unsigned_long>
               (idx_t radix_bits,Vector *args,Vector *args_1,unsigned_long *args_2,
               SelectionVector *args_3,unsigned_long *args_4)

{
  InternalException *this;
  allocator local_39;
  string local_38;
  
  switch(radix_bits) {
  case 0:
    ComputePartitionIndicesFunctor::Operation<0ul>(args,args_1,*args_2,args_3,*args_4);
    return;
  case 1:
    ComputePartitionIndicesFunctor::Operation<1ul>(args,args_1,*args_2,args_3,*args_4);
    return;
  case 2:
    ComputePartitionIndicesFunctor::Operation<2ul>(args,args_1,*args_2,args_3,*args_4);
    return;
  case 3:
    ComputePartitionIndicesFunctor::Operation<3ul>(args,args_1,*args_2,args_3,*args_4);
    return;
  case 4:
    ComputePartitionIndicesFunctor::Operation<4ul>(args,args_1,*args_2,args_3,*args_4);
    return;
  case 5:
    ComputePartitionIndicesFunctor::Operation<5ul>(args,args_1,*args_2,args_3,*args_4);
    return;
  case 6:
    ComputePartitionIndicesFunctor::Operation<6ul>(args,args_1,*args_2,args_3,*args_4);
    return;
  case 7:
    ComputePartitionIndicesFunctor::Operation<7ul>(args,args_1,*args_2,args_3,*args_4);
    return;
  case 8:
    ComputePartitionIndicesFunctor::Operation<8ul>(args,args_1,*args_2,args_3,*args_4);
    return;
  case 9:
    ComputePartitionIndicesFunctor::Operation<9ul>(args,args_1,*args_2,args_3,*args_4);
    return;
  case 10:
  case 0xb:
  case 0xc:
    ComputePartitionIndicesFunctor::Operation<10ul>(args,args_1,*args_2,args_3,*args_4);
    return;
  default:
    this = (InternalException *)__cxa_allocate_exception(0x10);
    ::std::__cxx11::string::string
              ((string *)&local_38,
               "radix_bits higher than RadixPartitioning::MAX_RADIX_BITS encountered in RadixBitsSwitch"
               ,&local_39);
    InternalException::InternalException(this,&local_38);
    __cxa_throw(this,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
  }
}

Assistant:

RETURN_TYPE RadixBitsSwitch(const idx_t radix_bits, ARGS &&... args) {
	D_ASSERT(radix_bits <= RadixPartitioning::MAX_RADIX_BITS);
	switch (radix_bits) {
	case 0:
		return OP::template Operation<0>(std::forward<ARGS>(args)...);
	case 1:
		return OP::template Operation<1>(std::forward<ARGS>(args)...);
	case 2:
		return OP::template Operation<2>(std::forward<ARGS>(args)...);
	case 3:
		return OP::template Operation<3>(std::forward<ARGS>(args)...);
	case 4:
		return OP::template Operation<4>(std::forward<ARGS>(args)...);
	case 5: // LCOV_EXCL_START
		return OP::template Operation<5>(std::forward<ARGS>(args)...);
	case 6:
		return OP::template Operation<6>(std::forward<ARGS>(args)...);
	case 7:
		return OP::template Operation<7>(std::forward<ARGS>(args)...);
	case 8:
		return OP::template Operation<8>(std::forward<ARGS>(args)...);
	case 9:
		return OP::template Operation<9>(std::forward<ARGS>(args)...);
	case 10:
		return OP::template Operation<10>(std::forward<ARGS>(args)...);
	case 11:
		return OP::template Operation<10>(std::forward<ARGS>(args)...);
	case 12:
		return OP::template Operation<10>(std::forward<ARGS>(args)...);
	default:
		throw InternalException(
		    "radix_bits higher than RadixPartitioning::MAX_RADIX_BITS encountered in RadixBitsSwitch");
	} // LCOV_EXCL_STOP
}